

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O3

void emit_METAL_finalize(Context *ctx)

{
  int iVar1;
  uint uVar2;
  Buffer *pBVar3;
  int iVar4;
  char *pcVar5;
  char *pcVar6;
  int iVar7;
  char *pcVar8;
  uint uVar9;
  bool bVar10;
  
  if (ctx->have_relative_input_registers != 0) {
    failf(ctx,"%s","Relative addressing of input registers not supported.");
  }
  push_output(ctx,&ctx->preflight);
  if (ctx->metal_need_header_common != 0) {
    output_line(ctx,"#include <metal_common>");
  }
  if (ctx->metal_need_header_math != 0) {
    output_line(ctx,"#include <metal_math>");
  }
  if (ctx->metal_need_header_relational != 0) {
    output_line(ctx,"#include <metal_relational>");
  }
  if (ctx->metal_need_header_geometric != 0) {
    output_line(ctx,"#include <metal_geometric>");
  }
  if (ctx->metal_need_header_graphics != 0) {
    output_line(ctx,"#include <metal_graphics>");
  }
  if (ctx->metal_need_header_texture != 0) {
    output_line(ctx,"#include <metal_texture>");
  }
  if (ctx->output != (Buffer *)0x0) {
    if (ctx->isfail == 0) {
      buffer_append(ctx->output,ctx->endline,(long)ctx->endline_len);
    }
    output_line(ctx,"using namespace metal;");
    if (ctx->output != (Buffer *)0x0) {
      if (ctx->isfail == 0) {
        buffer_append(ctx->output,ctx->endline,(long)ctx->endline_len);
      }
      if (0 < ctx->output_stack_len) {
        uVar2 = ctx->output_stack_len - 1;
        ctx->output_stack_len = uVar2;
        ctx->output = ctx->output_stack[uVar2];
        ctx->indent = ctx->indent_stack[uVar2];
        push_output(ctx,&ctx->mainline_intro);
        pcVar6 = "fragment";
        if (ctx->shader_type == MOJOSHADER_TYPE_VERTEX) {
          pcVar6 = "vertex";
        }
        bVar10 = ctx->outputs == (Buffer *)0x0;
        pcVar8 = "_Output";
        if (bVar10) {
          pcVar8 = "";
        }
        pcVar5 = "void";
        if (!bVar10) {
          pcVar5 = ctx->mainfn;
        }
        output_line(ctx,"%s %s%s %s (",pcVar6,pcVar5,pcVar8);
        if (0 < ctx->output_stack_len) {
          uVar2 = ctx->output_stack_len - 1;
          ctx->output_stack_len = uVar2;
          ctx->output = ctx->output_stack[uVar2];
          ctx->indent = ctx->indent_stack[uVar2];
          push_output(ctx,&ctx->mainline_arguments);
          ctx->indent = ctx->indent + 1;
          iVar4 = ctx->uniform_int4_count + ctx->uniform_float4_count;
          iVar1 = ctx->uniform_bool_count;
          pBVar3 = ctx->inputs;
          uVar2 = (uint)(iVar4 + iVar1 != 0);
          uVar9 = uVar2 + 1;
          if (pBVar3 == (Buffer *)0x0) {
            uVar9 = uVar2;
          }
          iVar7 = uVar9 - 1;
          if (uVar9 == 0) {
            iVar7 = 0;
          }
          if (iVar4 + iVar1 != 0 && SCARRY4(iVar4,iVar1) == iVar4 + iVar1 < 0) {
            push_output(ctx,&ctx->globals);
            output_line(ctx,"struct %s_Uniforms",ctx->mainfn);
            output_line(ctx,"{");
            ctx->indent = ctx->indent + 1;
            if (0 < ctx->uniform_float4_count) {
              output_line(ctx,"float4 uniforms_float4[%d];");
            }
            if (0 < ctx->uniform_int4_count) {
              output_line(ctx,"int4 uniforms_int4[%d];");
            }
            if (0 < ctx->uniform_bool_count) {
              output_line(ctx,"bool uniforms_bool[%d];");
            }
            ctx->indent = ctx->indent + -1;
            output_line(ctx,"};");
            if (ctx->output_stack_len < 1) goto LAB_0010e96e;
            uVar2 = ctx->output_stack_len - 1;
            ctx->output_stack_len = uVar2;
            ctx->output = ctx->output_stack[uVar2];
            ctx->indent = ctx->indent_stack[uVar2];
            pcVar6 = ",";
            if (uVar9 < 2) {
              pcVar6 = "";
            }
            output_line(ctx,"constant %s_Uniforms &uniforms [[buffer(16)]]%s",ctx->mainfn,pcVar6);
            iVar7 = iVar7 + -1;
            pBVar3 = ctx->inputs;
          }
          if (pBVar3 != (Buffer *)0x0) {
            pcVar6 = ",";
            if (iVar7 == 0) {
              pcVar6 = "";
            }
            output_line(ctx,"%s_Input input [[stage_in]]%s",ctx->mainfn,pcVar6);
          }
          ctx->indent = ctx->indent + -1;
          output_line(ctx,") {");
          if (ctx->outputs == (Buffer *)0x0) {
            uVar2 = ctx->output_stack_len;
          }
          else {
            ctx->indent = ctx->indent + 1;
            output_line(ctx,"%s_Output output;",ctx->mainfn);
            push_output(ctx,&ctx->mainline);
            ctx->indent = ctx->indent + 1;
            output_line(ctx,"return output;");
            if (ctx->output_stack_len < 1) goto LAB_0010e96e;
            uVar2 = ctx->output_stack_len - 1;
            ctx->output_stack_len = uVar2;
            ctx->output = ctx->output_stack[uVar2];
            ctx->indent = ctx->indent_stack[uVar2];
          }
          if (0 < (int)uVar2) {
            uVar2 = uVar2 - 1;
            ctx->output_stack_len = uVar2;
            ctx->output = ctx->output_stack[uVar2];
            ctx->indent = ctx->indent_stack[uVar2];
            if (ctx->inputs != (Buffer *)0x0) {
              push_output(ctx,&ctx->inputs);
              output_line(ctx,"};");
              if (ctx->output == (Buffer *)0x0) goto LAB_0010e98d;
              if (ctx->isfail == 0) {
                buffer_append(ctx->output,ctx->endline,(long)ctx->endline_len);
              }
              if (ctx->output_stack_len < 1) goto LAB_0010e96e;
              uVar2 = ctx->output_stack_len - 1;
              ctx->output_stack_len = uVar2;
              ctx->output = ctx->output_stack[uVar2];
              ctx->indent = ctx->indent_stack[uVar2];
            }
            if (ctx->outputs != (Buffer *)0x0) {
              push_output(ctx,&ctx->outputs);
              output_line(ctx,"};");
              if (ctx->output == (Buffer *)0x0) goto LAB_0010e98d;
              if (ctx->isfail == 0) {
                buffer_append(ctx->output,ctx->endline,(long)ctx->endline_len);
              }
              if (ctx->output_stack_len < 1) goto LAB_0010e96e;
              uVar2 = ctx->output_stack_len - 1;
              ctx->output_stack_len = uVar2;
              ctx->output = ctx->output_stack[uVar2];
              ctx->indent = ctx->indent_stack[uVar2];
            }
            if (ctx->globals != (Buffer *)0x0) {
              push_output(ctx,&ctx->globals);
              if (ctx->output == (Buffer *)0x0) goto LAB_0010e98d;
              if (ctx->isfail == 0) {
                buffer_append(ctx->output,ctx->endline,(long)ctx->endline_len);
              }
              if (ctx->output_stack_len < 1) goto LAB_0010e96e;
              uVar2 = ctx->output_stack_len - 1;
              ctx->output_stack_len = uVar2;
              ctx->output = ctx->output_stack[uVar2];
              ctx->indent = ctx->indent_stack[uVar2];
            }
            return;
          }
        }
      }
LAB_0010e96e:
      __assert_fail("ctx->output_stack_len > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader.c"
                    ,0x173,"void pop_output(Context *)");
    }
  }
LAB_0010e98d:
  __assert_fail("ctx->output != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader.c"
                ,0x1d3,"void output_blank_line(Context *)");
}

Assistant:

static void emit_METAL_finalize(Context *ctx)
{
    // If we had a relative addressing of REG_TYPE_INPUT, we need to build
    //  an array for it at the start of main(). GLSL doesn't let you specify
    //  arrays of attributes.
    //float4 blah_array[BIGGEST_ARRAY];
    if (ctx->have_relative_input_registers) // !!! FIXME
        fail(ctx, "Relative addressing of input registers not supported.");

    // Insert header includes we need...
    push_output(ctx, &ctx->preflight);
    #define INC_METAL_HEADER(name) \
        if (ctx->metal_need_header_##name) { \
            output_line(ctx, "#include <metal_" #name ">"); \
        }
    INC_METAL_HEADER(common);
    INC_METAL_HEADER(math);
    INC_METAL_HEADER(relational);
    INC_METAL_HEADER(geometric);
    INC_METAL_HEADER(graphics);
    INC_METAL_HEADER(texture);
    #undef INC_METAL_HEADER
    output_blank_line(ctx);
    output_line(ctx, "using namespace metal;");
    output_blank_line(ctx);
    pop_output(ctx);

    // Fill in the shader's mainline function signature.
    push_output(ctx, &ctx->mainline_intro);
    output_line(ctx, "%s %s%s %s (",
                shader_is_vertex(ctx) ? "vertex" : "fragment",
                ctx->outputs ? ctx->mainfn : "void",
                ctx->outputs ? "_Output" : "", ctx->mainfn);
    pop_output(ctx);

    push_output(ctx, &ctx->mainline_arguments);
    ctx->indent++;

    const int uniform_count = ctx->uniform_float4_count + ctx->uniform_int4_count + ctx->uniform_bool_count;
    int commas = 0;
    if (uniform_count) commas++;
    if (ctx->inputs) commas++;
    if (commas) commas--;

    if (uniform_count > 0)
    {
        push_output(ctx, &ctx->globals);
        output_line(ctx, "struct %s_Uniforms", ctx->mainfn);
        output_line(ctx, "{");
        ctx->indent++;
        if (ctx->uniform_float4_count > 0)
            output_line(ctx, "float4 uniforms_float4[%d];", ctx->uniform_float4_count);
        if (ctx->uniform_int4_count > 0)
            output_line(ctx, "int4 uniforms_int4[%d];", ctx->uniform_int4_count);
        if (ctx->uniform_bool_count > 0)
            output_line(ctx, "bool uniforms_bool[%d];", ctx->uniform_bool_count);
        ctx->indent--;
        output_line(ctx, "};");
        pop_output(ctx);

        output_line(ctx, "constant %s_Uniforms &uniforms [[buffer(16)]]%s", ctx->mainfn, commas ? "," : "");
        commas--;
    } // if

    if (ctx->inputs)
    {
        output_line(ctx, "%s_Input input [[stage_in]]%s", ctx->mainfn, commas ? "," : "");
        commas--;
    } // if

    ctx->indent--;
    output_line(ctx, ") {");
    if (ctx->outputs)
    {
        ctx->indent++;
        output_line(ctx, "%s_Output output;", ctx->mainfn);

        push_output(ctx, &ctx->mainline);
        ctx->indent++;
        output_line(ctx, "return output;");
        pop_output(ctx);
    } // if
    pop_output(ctx);

    if (ctx->inputs)
    {
        push_output(ctx, &ctx->inputs);
        output_line(ctx, "};");
        output_blank_line(ctx);
        pop_output(ctx);
    } // if

    if (ctx->outputs)
    {
        push_output(ctx, &ctx->outputs);
        output_line(ctx, "};");
        output_blank_line(ctx);
        pop_output(ctx);
    } // if

    // throw some blank lines around to make source more readable.
    if (ctx->globals)  // don't add a blank line if the section is empty.
    {
        push_output(ctx, &ctx->globals);
        output_blank_line(ctx);
        pop_output(ctx);
    } // if
}